

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test::testBody
          (TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_20 [24];
  TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test *this_local;
  
  local_20._16_8_ = this;
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,0);
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  MemoryAccountant::dealloc
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  MemoryAccountant::alloc(&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  pUVar1 = UtestShell::getCurrent();
  MemoryAccountant::report((MemoryAccountant *)local_20);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "CppUTest Memory Accountant report:\nAllocation size     # allocations    # deallocations   max # allocations at one time\nother                   0                1                 0\n    4                   1                2                 1\n   Thank you for your business\n"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x1d0,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_20);
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportAllocationsWithSizeZero)
{
    accountant.dealloc(0);

    accountant.dealloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);

    STRCMP_EQUAL("CppUTest Memory Accountant report:\n"
                 "Allocation size     # allocations    # deallocations   max # allocations at one time\n"
                 "other                   0                1                 0\n"
                 "    4                   1                2                 1\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}